

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O1

void __thiscall my_llama_file::read_raw(my_llama_file *this,void *ptr,size_t size)

{
  char *pcVar1;
  int iVar2;
  FILE *this_00;
  size_t sVar3;
  FILE *__stream;
  char *__s;
  
  if (size == 0) {
    return;
  }
  this_00 = (FILE *)__errno_location();
  this_00->_flags = 0;
  sVar3 = fread(ptr,size,1,(FILE *)this->fp);
  __stream = (FILE *)this->fp;
  iVar2 = ferror(__stream);
  if (iVar2 == 0) {
    this_00 = __stream;
    if (sVar3 == 1) {
      return;
    }
  }
  else {
    read_raw((my_llama_file *)this_00);
  }
  read_raw();
  if (-1 < (long)size) {
    *(undefined8 *)this_00 = 0;
    this_00->_IO_read_ptr = (char *)0x0;
    this_00->_IO_read_end = (char *)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              ((_Vector_base<char,_std::allocator<char>_> *)this_00,size);
    pcVar1 = *(char **)this_00;
    __s = pcVar1;
    if (size != 0) {
      *pcVar1 = '\0';
      __s = pcVar1 + 1;
      if (size - 1 != 0) {
        memset(__s,0,size - 1);
        __s = pcVar1 + size;
      }
    }
    this_00->_IO_read_ptr = __s;
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void read_raw(void * ptr, size_t size) {
        if (size == 0) {
            return;
        }
        errno = 0;
        std::size_t ret = std::fread(ptr, size, 1, fp);
        if (ferror(fp)) {
            die_fmt("fread failed: %s", strerror(errno));
        }
        if (ret != 1) {
            die("unexpectedly reached end of file");
        }
    }